

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool cmGlobalGenerator::IsReservedTarget(string *name)

{
  char **ppcVar1;
  long lVar2;
  undefined8 *puVar3;
  char *reservedTargets [10];
  
  puVar3 = &DAT_0057cab0;
  ppcVar1 = reservedTargets;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *ppcVar1 = (char *)*puVar3;
    puVar3 = puVar3 + 1;
    ppcVar1 = ppcVar1 + 1;
  }
  ppcVar1 = std::
            __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (reservedTargets,&stack0xfffffffffffffff8,name);
  return ppcVar1 != (char **)&stack0xfffffffffffffff8;
}

Assistant:

bool cmGlobalGenerator::IsReservedTarget(std::string const& name)
{
  // The following is a list of targets reserved
  // by one or more of the cmake generators.

  // Adding additional targets to this list will require a policy!
  const char* reservedTargets[] = { "all",       "ALL_BUILD",  "help",
                                    "install",   "INSTALL",    "preinstall",
                                    "clean",     "edit_cache", "rebuild_cache",
                                    "ZERO_CHECK" };

  return std::find(cm::cbegin(reservedTargets), cm::cend(reservedTargets),
                   name) != cm::cend(reservedTargets);
}